

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer-source-line-finder.cc
# Opt level: O2

Result __thiscall
wabt::LexerSourceLineFinder::GetSourceLine
          (LexerSourceLineFinder *this,Location *loc,Offset max_line_length,
          SourceLine *out_source_line)

{
  unsigned_long uVar1;
  Result RVar2;
  unsigned_long uVar3;
  unsigned_long uVar4;
  Enum EVar5;
  unsigned_long uVar6;
  Offset in_R8;
  OffsetRange range;
  OffsetRange OVar7;
  OffsetRange original;
  vector<char,_std::allocator<char>_> read_line;
  
  uVar3 = *(unsigned_long *)((long)&(loc->field_1).field_1.offset + 4);
  original.start = 0;
  original.end = 0;
  RVar2 = GetLineOffsets(this,(loc->field_1).field_0.line,&original);
  uVar1 = original.end;
  uVar6 = original.start;
  if (RVar2.enum_ == Error) {
    EVar5 = Error;
  }
  else {
    OVar7.end = uVar3;
    OVar7.start = original.end;
    OVar7 = ClampSourceLineOffsets
                      ((LexerSourceLineFinder *)original.start,OVar7,(ColumnRange)max_line_length,
                       in_R8);
    uVar3 = OVar7.end;
    out_source_line->column_offset = (int)OVar7.start - (int)uVar6;
    if (OVar7.start != uVar6) {
      std::__cxx11::string::append((char *)out_source_line);
      uVar6 = OVar7.start + 3;
    }
    uVar4 = uVar3 - 3;
    if (uVar1 == uVar3) {
      uVar4 = uVar3;
    }
    read_line.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    read_line.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    read_line.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    range.end = uVar4;
    range.start = uVar6;
    RVar2 = LexerSource::ReadRange
                      ((this->source_)._M_t.
                       super___uniq_ptr_impl<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_wabt::LexerSource_*,_std::default_delete<wabt::LexerSource>_>
                       .super__Head_base<0UL,_wabt::LexerSource_*,_false>._M_head_impl,range,
                       &read_line);
    if (RVar2.enum_ == Error) {
      EVar5 = Error;
    }
    else {
      std::__cxx11::string::
      append<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
                ((string *)out_source_line,
                 (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
                 read_line.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
                 read_line.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      EVar5 = Ok;
      if (uVar1 != uVar3) {
        std::__cxx11::string::append((char *)out_source_line);
      }
    }
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              (&read_line.super__Vector_base<char,_std::allocator<char>_>);
  }
  return (Result)EVar5;
}

Assistant:

Result LexerSourceLineFinder::GetSourceLine(const Location& loc,
                                            Offset max_line_length,
                                            SourceLine* out_source_line) {
  ColumnRange column_range(loc.first_column, loc.last_column);
  OffsetRange original;
  CHECK_RESULT(GetLineOffsets(loc.line, &original));

  OffsetRange clamped =
      ClampSourceLineOffsets(original, column_range, max_line_length);
  bool has_start_ellipsis = original.start != clamped.start;
  bool has_end_ellipsis = original.end != clamped.end;

  out_source_line->column_offset = clamped.start - original.start;

  if (has_start_ellipsis) {
    out_source_line->line += "...";
    clamped.start += 3;
  }
  if (has_end_ellipsis) {
    clamped.end -= 3;
  }

  std::vector<char> read_line;
  CHECK_RESULT(source_->ReadRange(clamped, &read_line));
  out_source_line->line.append(read_line.begin(), read_line.end());

  if (has_end_ellipsis) {
    out_source_line->line += "...";
  }

  return Result::Ok;
}